

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

void Gia_PolynCorePrintCones(Gia_Man_t *pGia,Vec_Int_t *vLeaves,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iObj;
  int local_3c;
  Vec_Int_t *local_38;
  
  uVar1 = vLeaves->nSize;
  uVar5 = (ulong)uVar1;
  if (fVerbose == 0) {
    if ((int)uVar1 < 1) {
      uVar3 = 0;
      uVar1 = 0;
    }
    else {
      lVar4 = 0;
      uVar1 = 0;
      uVar3 = 0;
      local_38 = vLeaves;
      do {
        local_3c = vLeaves->pArray[lVar4];
        uVar2 = Gia_ManSuppSize(pGia,&local_3c,1);
        vLeaves = local_38;
        if ((int)uVar2 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = uVar2;
        uVar2 = Gia_ManConeSize(pGia,&local_3c,1);
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar1 = uVar2;
        lVar4 = lVar4 + 1;
        uVar5 = (ulong)vLeaves->nSize;
      } while (lVar4 < (long)uVar5);
    }
    printf("Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n",uVar5,(ulong)uVar3,
           (ulong)uVar1);
  }
  else if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      local_3c = vLeaves->pArray[uVar5];
      printf("%4d : ",uVar5 & 0xffffffff);
      uVar1 = Gia_ManSuppSize(pGia,&local_3c,1);
      printf("Supp = %3d  ",(ulong)uVar1);
      uVar1 = Gia_ManConeSize(pGia,&local_3c,1);
      printf("Cone = %3d  ",(ulong)uVar1);
      putchar(10);
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)vLeaves->nSize);
  }
  return;
}

Assistant:

void Gia_PolynCorePrintCones( Gia_Man_t * pGia, Vec_Int_t * vLeaves, int fVerbose )
{
    int i, iObj;
    if ( fVerbose )
    {
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            printf( "%4d : ", i );
            printf( "Supp = %3d  ", Gia_ManSuppSize(pGia, &iObj, 1) );
            printf( "Cone = %3d  ", Gia_ManConeSize(pGia, &iObj, 1) );
            printf( "\n" );
        }
    }
    else
    {
        int SuppMax = 0, ConeMax = 0;
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            SuppMax = Abc_MaxInt( SuppMax, Gia_ManSuppSize(pGia, &iObj, 1) );
            ConeMax = Abc_MaxInt( ConeMax, Gia_ManConeSize(pGia, &iObj, 1) );
        }
        printf( "Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n", Vec_IntSize(vLeaves), SuppMax, ConeMax );
    }
}